

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * kj::_::fill<kj::StringPtr,kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>>
                 (char *target,StringPtr *first,Delimited<kj::ArrayPtr<const_unsigned_char>_> *rest)

{
  char *pcVar1;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> *first_00;
  char *end;
  char *i;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> *rest_local;
  StringPtr *first_local;
  char *target_local;
  
  end = StringPtr::begin(first);
  pcVar1 = StringPtr::end(first);
  first_local = (StringPtr *)target;
  while (end != pcVar1) {
    *(char *)&(first_local->content).ptr = *end;
    end = end + 1;
    first_local = (StringPtr *)((long)&(first_local->content).ptr + 1);
  }
  first_00 = fwd<kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>>(rest);
  pcVar1 = fill<kj::ArrayPtr<unsigned_char_const>>((char *)first_local,first_00);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}